

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

Array<Qentem::Value<char16_t>_> * __thiscall
Qentem::Array<Qentem::Value<char16_t>_>::operator=
          (Array<Qentem::Value<char16_t>_> *this,Array<Qentem::Value<char16_t>_> *src)

{
  uint uVar1;
  SizeT SVar2;
  Value<char16_t> *pointer;
  Value<char16_t> *this_00;
  
  if (this != src) {
    pointer = this->storage_;
    uVar1 = this->index_;
    this->storage_ = (Value<char16_t> *)0x0;
    SVar2 = src->index_;
    this->index_ = SVar2;
    this->capacity_ = SVar2;
    if (SVar2 != 0) {
      copyArray(this,src);
    }
    if ((ulong)uVar1 != 0) {
      this_00 = pointer;
      do {
        if (this_00 != (Value<char16_t> *)0x0) {
          Value<char16_t>::~Value(this_00);
        }
        this_00 = this_00 + 1;
      } while (this_00 < pointer + uVar1);
    }
    if (pointer != (Value<char16_t> *)0x0) {
      MemoryRecord::RemoveAllocation(pointer);
    }
    operator_delete(pointer);
  }
  return this;
}

Assistant:

Array &operator=(const Array &src) {
        if (this != &src) {
            Type_T     *storage = Storage();
            const SizeT size    = Size();

            clearStorage();
            setSize(src.Size());
            setCapacity(src.Size());

            if (IsNotEmpty()) {
                copyArray(src);
            }

            // Just in case the copied array is not a child array.
            Memory::Dispose(storage, (storage + size));
            Memory::Deallocate(storage);
        }

        return *this;
    }